

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityGenerator.h
# Opt level: O0

PduPtr * EntityGenerator::GenerateEntityRef(void)

{
  undefined4 ID;
  ostream *this;
  Entity_State_PDU *this_00;
  Header6 *pHVar1;
  KRef_Ptr<KDIS::PDU::Header7> *in_RDI;
  TimeStamp local_348;
  undefined1 local_331;
  EulerAngles local_330;
  undefined1 local_311;
  undefined1 local_310 [8];
  EntityCapabilities EntEC;
  undefined1 local_2e0 [8];
  EntityMarking EntMarking;
  KStringStream name;
  ostream local_2b8 [376];
  Vector local_140;
  Vector local_128;
  undefined1 local_110 [8];
  DeadReckoningParameter DRP;
  EntityAppearance EntEA;
  WorldCoordinates EntityLocation;
  KFLOAT64 Roll;
  KFLOAT64 Pitch;
  KFLOAT64 Heading;
  KFLOAT64 GeoZ;
  KFLOAT64 GeoY;
  KFLOAT64 GeoX;
  Vector EntityLinearVelocity;
  undefined1 local_40 [8];
  EntityType EntType;
  undefined1 local_28 [4];
  ForceID EntForceID;
  EntityIdentifier EntID;
  KUINT16 randomValue;
  PduPtr *pEntity;
  
  id = id + 1;
  EntID.super_SimulationIdentifier._14_2_ = SUB42(id,0);
  KDIS::DATA_TYPE::EntityIdentifier::EntityIdentifier
            ((EntityIdentifier *)local_28,1,0xbb9,EntID.super_SimulationIdentifier._14_2_);
  EntType.m_ui8Category = '\x01';
  EntType.m_ui8SubCategory = '\0';
  EntType.m_ui8Specific = '\0';
  EntType.m_ui8Extra = '\0';
  KDIS::DATA_TYPE::EntityType::EntityType
            ((EntityType *)local_40,'\x03','\x01',0xe1,'\x03','\0','\x01','\0');
  KDIS::DATA_TYPE::Vector::Vector((Vector *)&GeoX,0.0,0.0,0.0);
  KDIS::DATA_TYPE::WorldCoordinates::WorldCoordinates
            ((WorldCoordinates *)&EntEA.m_Appearance,3974445.65712107,220612.57183252,
             4966838.38051275);
  KDIS::DATA_TYPE::EntityAppearance::EntityAppearance
            ((EntityAppearance *)&DRP.m_AngularVelocity.m_f32Z);
  KDIS::DATA_TYPE::Vector::Vector(&local_128,0.0,0.0,0.0);
  KDIS::DATA_TYPE::Vector::Vector(&local_140,0.0,0.0,0.0);
  KDIS::DATA_TYPE::DeadReckoningParameter::DeadReckoningParameter
            ((DeadReckoningParameter *)local_110,Static,&local_128,&local_140);
  KDIS::DATA_TYPE::Vector::~Vector(&local_140);
  KDIS::DATA_TYPE::Vector::~Vector(&local_128);
  std::__cxx11::stringstream::stringstream((stringstream *)(EntMarking.m_sEntityMarkingString + 7));
  this = std::operator<<(local_2b8,"Ent-");
  std::ostream::operator<<(this,EntID.super_SimulationIdentifier._14_2_);
  std::__cxx11::stringstream::str();
  KDIS::DATA_TYPE::EntityMarking::EntityMarking
            ((EntityMarking *)local_2e0,ASCII,(KString *)&EntEC.field_0.field_0);
  std::__cxx11::string::~string((string *)&EntEC.field_0.field_0);
  KDIS::DATA_TYPE::EntityCapabilities::EntityCapabilities
            ((EntityCapabilities *)local_310,false,false,false,false);
  local_311 = 0;
  this_00 = (Entity_State_PDU *)operator_new(0x150);
  ID = EntType._12_4_;
  local_331 = 1;
  KDIS::DATA_TYPE::EulerAngles::EulerAngles(&local_330);
  KDIS::PDU::Entity_State_PDU::Entity_State_PDU
            (this_00,(EntityIdentifier *)local_28,ID,(EntityType *)local_40,(EntityType *)local_40,
             (Vector *)&GeoX,(WorldCoordinates *)&EntEA.m_Appearance,&local_330,
             (EntityAppearance *)&DRP.m_AngularVelocity.m_f32Z,(DeadReckoningParameter *)local_110,
             (EntityMarking *)local_2e0,(EntityCapabilities *)local_310);
  local_331 = 0;
  KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>::KRef_Ptr(in_RDI,(Header7 *)this_00);
  KDIS::DATA_TYPE::EulerAngles::~EulerAngles(&local_330);
  pHVar1 = &KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>::operator->(in_RDI)->super_Header6;
  KDIS::PDU::Header6::SetExerciseID(pHVar1,'\x01');
  pHVar1 = &KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>::operator->(in_RDI)->super_Header6;
  KDIS::DATA_TYPE::TimeStamp::TimeStamp(&local_348,RelativeTime,0,true);
  KDIS::PDU::Header6::SetTimeStamp(pHVar1,&local_348);
  KDIS::DATA_TYPE::TimeStamp::~TimeStamp(&local_348);
  local_311 = 1;
  KDIS::DATA_TYPE::EntityCapabilities::~EntityCapabilities((EntityCapabilities *)local_310);
  KDIS::DATA_TYPE::EntityMarking::~EntityMarking((EntityMarking *)local_2e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(EntMarking.m_sEntityMarkingString + 7))
  ;
  KDIS::DATA_TYPE::DeadReckoningParameter::~DeadReckoningParameter
            ((DeadReckoningParameter *)local_110);
  KDIS::DATA_TYPE::EntityAppearance::~EntityAppearance
            ((EntityAppearance *)&DRP.m_AngularVelocity.m_f32Z);
  KDIS::DATA_TYPE::WorldCoordinates::~WorldCoordinates((WorldCoordinates *)&EntEA.m_Appearance);
  KDIS::DATA_TYPE::Vector::~Vector((Vector *)&GeoX);
  KDIS::DATA_TYPE::EntityType::~EntityType((EntityType *)local_40);
  KDIS::DATA_TYPE::EntityIdentifier::~EntityIdentifier((EntityIdentifier *)local_28);
  return in_RDI;
}

Assistant:

static PduPtr GenerateEntityRef()
	{
		// Generate a new value to use for our entity. Id, name, pos etc.
		KUINT16 randomValue = ++id;

		// First create the PDU we are going to send, for this example I will use a
		// Entity_State_PDU, When this PDU is sent most DIS applications should then show a new entity
		EntityIdentifier EntID( 1, 3001, randomValue );
		ForceID EntForceID( Friendly );
		EntityType EntType( 3, 1, 225, 3, 0, 1, 0 ); // A Civilian male
		Vector EntityLinearVelocity( 0, 0, 0 );

		// Location 
		KFLOAT64 GeoX = 3974445.65712107, GeoY = 220612.57183252, GeoZ = 4966838.38051275; // Cardiff 
		KFLOAT64 Heading = 0.0, Pitch = 0.0, Roll = 0.0;
		WorldCoordinates EntityLocation( GeoX, GeoY, GeoZ );

		// Appearance
		EntityAppearance EntEA; 
		DeadReckoningParameter DRP( Static, Vector( 0, 0, 0 ), Vector( 0, 0, 0 ) );
		KStringStream name;
		name << "Ent-" << randomValue;
		EntityMarking EntMarking( ASCII, name.str() );
		EntityCapabilities EntEC( false, false, false, false );

		// Create the PDU
		PduPtr pEntity( new Entity_State_PDU( EntID, EntForceID, EntType, EntType, EntityLinearVelocity,
                        EntityLocation, EulerAngles(), EntEA, DRP, EntMarking, EntEC ) );

		// Set the PDU Header values
		pEntity->SetExerciseID( 1 );

		// Set the time stamp to automatically calculate each time encode is called.
		pEntity->SetTimeStamp( TimeStamp( RelativeTime, 0, true ) );

		return pEntity;
	}